

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructBody
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t index,bool in_array)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *field;
  StructDef *pSVar3;
  EnumDef *pEVar4;
  undefined8 uVar5;
  unsigned_long uVar6;
  pointer ppFVar7;
  pointer ppFVar8;
  unsigned_long t;
  _Alloc_hider local_158;
  undefined2 uStack_150;
  undefined6 uStack_14e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_148;
  CSharpGenerator *local_130;
  size_t local_128;
  StructDef *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  size_t local_80;
  unsigned_long local_78;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_130 = this;
  local_128 = index;
  local_120 = struct_def;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)index * '\x02' + '\x02');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                 &indent,"  builder.Prep(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_158);
  NumToString<unsigned_long>(&index_var,local_120->minalign);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                 &index_var,", ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&index_var);
  NumToString<unsigned_long>(&index_var,local_120->bytesize);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                 &index_var,");\n");
  std::__cxx11::string::append((string *)code_ptr);
  local_80 = local_128 + 1;
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&index_var);
  ppFVar7 = (local_120->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    ppFVar8 = ppFVar7;
    while( true ) {
      ppFVar7 = ppFVar8 + -1;
      if (ppFVar8 ==
          (local_120->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::~string((string *)&indent);
        return;
      }
      field = *ppFVar7;
      if (field->padding != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,&indent,"  builder.Pad(");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_158);
        NumToString<unsigned_long>(&index_var,field->padding);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_158,&index_var,");\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&index_var);
      }
      pVVar1 = &field->value;
      BVar2 = (pVVar1->type).base_type;
      if (BVar2 != BASE_TYPE_STRUCT) break;
      pSVar3 = (field->value).type.struct_def;
      if (pSVar3->fixed == false) goto LAB_0017a592;
      std::operator+(&index_var,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field,"_")
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158
                     ,nameprefix,&index_var);
      GenStructBody(local_130,pSVar3,code_ptr,local_158._M_p,local_128,(bool)(in_array & 1));
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&index_var);
      ppFVar8 = ppFVar7;
    }
    if (BVar2 == BASE_TYPE_ARRAY) {
      aStack_148._8_2_ = (field->value).type.fixed_length;
      local_158._M_p._4_4_ = 0;
      local_158._M_p._0_4_ = (field->value).type.element;
      pSVar3 = (field->value).type.struct_def;
      pEVar4 = (field->value).type.enum_def;
      uStack_150 = SUB82(pSVar3,0);
      uStack_14e = (undefined6)((ulong)pSVar3 >> 0x10);
      aStack_148._M_allocated_capacity._0_2_ = SUB82(pEVar4,0);
      aStack_148._M_allocated_capacity._2_6_ = (undefined6)((ulong)pEVar4 >> 0x10);
      goto LAB_0017a5a4;
    }
LAB_0017a592:
    local_158._M_p = *(pointer *)&pVVar1->type;
    pSVar3 = (field->value).type.struct_def;
    uVar5 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
    aStack_148._M_allocated_capacity._0_2_ =
         (undefined2)((ulong)*(undefined8 *)((long)&(field->value).type.struct_def + 2) >> 0x30);
    aStack_148._M_allocated_capacity._2_6_ = (undefined6)uVar5;
    aStack_148._8_2_ = (undefined2)((ulong)uVar5 >> 0x30);
    uStack_150 = SUB82(pSVar3,0);
    uStack_14e = (undefined6)((ulong)pSVar3 >> 0x10);
LAB_0017a5a4:
    NumToString<unsigned_long>(&argname,local_128);
    std::operator+(&index_var,"_idx",&argname);
    std::__cxx11::string::~string((string *)&argname);
    if ((pVVar1->type).base_type == BASE_TYPE_ARRAY) {
      std::operator+(&local_a0,&indent,"  for (int ");
      std::operator+(&local_c0,&local_a0,&index_var);
      std::operator+(&argname,&local_c0," = ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      NumToString<unsigned_short>(&argname,(field->value).type.fixed_length);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      std::operator+(&local_50,"; ",&index_var);
      std::operator+(&local_a0,&local_50," > 0; ");
      std::operator+(&local_c0,&local_a0,&index_var);
      std::operator+(&argname,&local_c0,"--) {\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_50);
      in_array = true;
    }
    if (((BaseType)local_158._M_p == BASE_TYPE_STRUCT) &&
       (*(char *)(CONCAT62(uStack_14e,uStack_150) + 0x110) == '\x01')) {
      pSVar3 = (field->value).type.struct_def;
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field,"_")
      ;
      std::operator+(&argname,nameprefix,&local_c0);
      GenStructBody(local_130,pSVar3,code_ptr,argname._M_dataplus._M_p,local_80,(bool)(in_array & 1)
                   );
      std::__cxx11::string::~string((string *)&argname);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      std::__cxx11::string::append((char *)code_ptr);
      std::operator+(&argname,&indent,"  builder.Put");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      GenMethod_abi_cxx11_(&local_c0,local_130,(Type *)&local_158);
      std::operator+(&argname,&local_c0,"(");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      std::__cxx11::string::~string((string *)&local_c0);
      SourceCast_abi_cxx11_(&argname,local_130,(Type *)&local_158,false);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
      Name_abi_cxx11_(&local_c0,local_130,field);
      std::operator+(&argname,nameprefix,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::append((string *)code_ptr);
      uVar6 = ((pVVar1->type).base_type == BASE_TYPE_ARRAY) + local_128;
      if (uVar6 != 0) {
        std::__cxx11::string::append((char *)code_ptr);
        if ((in_array & 1U) != 0) {
          local_78 = uVar6 - 1;
          for (t = 0; uVar6 != t; t = t + 1) {
            NumToString<unsigned_long>(&local_50,t);
            std::operator+(&local_a0,"_idx",&local_50);
            std::operator+(&local_c0,&local_a0,"-1");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_50);
            if (local_78 != t) {
              std::__cxx11::string::append((char *)code_ptr);
            }
          }
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
    }
    if ((pVVar1->type).base_type == BASE_TYPE_ARRAY) {
      std::operator+(&argname,&indent,"  }\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&argname);
    }
    std::__cxx11::string::~string((string *)&index_var);
  } while( true );
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t index = 0,
                     bool in_array = false) const {
    std::string &code = *code_ptr;
    std::string indent((index + 1) * 2, ' ');
    code += indent + "  builder.Prep(";
    code += NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ");\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field.padding) {
        code += indent + "  builder.Pad(";
        code += NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field_type)) {
        GenStructBody(*field_type.struct_def, code_ptr,
                      (nameprefix + (field.name + "_")).c_str(), index,
                      in_array);
      } else {
        const auto &type =
            IsArray(field_type) ? field_type.VectorType() : field_type;
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "  for (int " + index_var + " = ";
          code += NumToString(field_type.fixed_length);
          code += "; " + index_var + " > 0; " + index_var + "--) {\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          GenStructBody(*field_type.struct_def, code_ptr,
                        (nameprefix + (field.name + "_")).c_str(), index + 1,
                        in_array);
        } else {
          code += IsArray(field_type) ? "  " : "";
          code += indent + "  builder.Put";
          code += GenMethod(type) + "(";
          code += SourceCast(type);
          auto argname = nameprefix + Name(field);
          code += argname;
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          if (array_cnt > 0) {
            code += "[";
            for (size_t i = 0; in_array && i < array_cnt; i++) {
              code += "_idx" + NumToString(i) + "-1";
              if (i != (array_cnt - 1)) code += ",";
            }
            code += "]";
          }
          code += ");\n";
        }
        if (IsArray(field_type)) { code += indent + "  }\n"; }
      }
    }
  }